

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::Triplet::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,Triplet *this,
          Vector3d *position)

{
  Scalar *pSVar1;
  VectorXd pv;
  void *local_a8 [2];
  Scalar local_98;
  Scalar local_90;
  CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_88;
  CwiseBinaryOp<Eigen::internal::scalar_min_op<double,_double,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_60;
  
  local_60.m_lhs.m_lhs = (LhsNested)&this->_basis;
  local_60._0_8_ = position;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&pv,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)&local_60);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pv,0);
  if (-1e-11 <= *pSVar1) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pv,1);
    if (-1e-11 <= *pSVar1) {
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pv,2);
      if (-1e-11 <= *pSVar1) {
        local_60._0_8_ =
             Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&pv);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
                  ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&pv,(Scalar *)&local_60);
        local_90 = 0.0;
        Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseMax
                  (&local_88,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&pv,&local_90);
        local_98 = 1.0;
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
        ::cwiseMin(&local_60,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)&local_88,&local_98);
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,double,0>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,double,0>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>>
                  ((Matrix<double,_1,1,0,_1,1> *)local_a8,&local_60);
        boost::optional_detail::optional_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
        optional_base(&__return_storage_ptr__->super_type,local_a8);
        free(local_a8[0]);
        goto LAB_0014b5b0;
      }
    }
  }
  (__return_storage_ptr__->super_type).m_initialized = false;
LAB_0014b5b0:
  free(pv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Eigen::VectorXd> Triplet::handle(
      Eigen::Vector3d position) const {
    Eigen::VectorXd pv = position.transpose() * _basis;
    double epsilon = -1e-11;
    if (pv(0) >= epsilon && pv(1) >= epsilon && pv(2) >= epsilon) {
      pv /= pv.norm();
      return pv.cwiseMax(0.0).cwiseMin(1.0).eval();
    }
    return boost::none;
  }